

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O2

void __thiscall
nivalis::anon_unknown_3::Differentiator::Differentiator
          (Differentiator *this,AST *ast,uint64_t var_addr,Environment *env,
          vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *out)

{
  this->nodes = ast;
  this->ast_root =
       (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
       _M_impl.super__Vector_impl_data._M_start;
  this->var_addr = var_addr;
  (this->argv).
  super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->argv).
  super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->argv).
  super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Environment::Environment(&this->env,env);
  this->out = out;
  (this->vis_asts)._M_h._M_buckets = &(this->vis_asts)._M_h._M_single_bucket;
  (this->vis_asts)._M_h._M_bucket_count = 1;
  (this->vis_asts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vis_asts)._M_h._M_element_count = 0;
  (this->vis_asts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vis_asts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vis_asts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__detail::
  _Insert_base<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->vis_asts,&this->ast_root);
  return;
}

Assistant:

Differentiator(const Expr::AST& ast, uint64_t var_addr,
            Environment& env, std::vector<Expr::ASTNode>& out)
        : nodes(ast), ast_root(&ast[0]), var_addr(var_addr), env(env), out(out) {
        vis_asts.insert(ast_root);
    }